

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# flexfloat.c
# Opt level: O1

void ff_sqrt(flexfloat_t *dest,flexfloat_t *a)

{
  double dVar1;
  
  dVar1 = sqrt(a->value);
  dest->value = dVar1;
  flexfloat_sanitize(dest);
  return;
}

Assistant:

INLINE void ff_sqrt(flexfloat_t *dest, const flexfloat_t *a) {
    assert((dest->desc.exp_bits == a->desc.exp_bits) && (dest->desc.frac_bits == a->desc.frac_bits));
    dest->value = sqrt(a->value);
    #ifdef FLEXFLOAT_TRACKING
    dest->exact_value = sqrt(a->value);
    if(dest->tracking_fn) (dest->tracking_fn)(dest, dest->tracking_arg);
    #endif
    flexfloat_sanitize(dest);
    #ifdef FLEXFLOAT_STATS
    // TODO STATS
    // if(StatsEnabled) getOpStats(dest->desc)->sqrt += 1;
    #endif
}